

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GenerateFrameworkInfoPList
          (cmLocalGenerator *this,cmTarget *target,string *targetName,char *fname)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  string *psVar6;
  char *infile;
  char *local_348;
  cmNewLineStyle local_320;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  allocator local_279;
  string local_278;
  cmMakefile *local_258;
  cmMakefile *mf;
  string local_248 [32];
  undefined1 local_228 [8];
  ostringstream e;
  undefined1 local_b0 [8];
  string inMod;
  string local_88 [8];
  string inFile;
  allocator local_51;
  string local_50;
  char *local_30;
  char *in;
  char *fname_local;
  string *targetName_local;
  cmTarget *target_local;
  cmLocalGenerator *this_local;
  
  in = fname;
  fname_local = (char *)targetName;
  targetName_local = (string *)target;
  target_local = (cmTarget *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"MACOSX_FRAMEWORK_INFO_PLIST",&local_51);
  pcVar3 = cmTarget::GetProperty(target,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((pcVar3 == (char *)0x0) || (local_348 = pcVar3, *pcVar3 == '\0')) {
    local_348 = "MacOSXFrameworkInfo.plist.in";
  }
  local_30 = pcVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,local_348,(allocator *)(inMod.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(inMod.field_2._M_local_buf + 0xf));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar3);
  if (!bVar2) {
    pcVar1 = this->Makefile;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::GetModulesFile_abi_cxx11_((string *)local_b0,pcVar1,pcVar3);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator=(local_88,(string *)local_b0);
    }
    std::__cxx11::string::~string((string *)local_b0);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar2 = cmsys::SystemTools::FileExists(pcVar3,true);
  if (bVar2) {
    local_258 = this->Makefile;
    cmMakefile::PushScope(local_258);
    pcVar1 = local_258;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_278,"MACOSX_FRAMEWORK_NAME",&local_279);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(pcVar1,&local_278,pcVar3);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    psVar6 = targetName_local;
    pcVar1 = local_258;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a0,"MACOSX_FRAMEWORK_ICON_FILE",&local_2a1);
    cmLGInfoProp(pcVar1,(cmTarget *)psVar6,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    psVar6 = targetName_local;
    pcVar1 = local_258;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c8,"MACOSX_FRAMEWORK_IDENTIFIER",&local_2c9);
    cmLGInfoProp(pcVar1,(cmTarget *)psVar6,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    psVar6 = targetName_local;
    pcVar1 = local_258;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2f0,"MACOSX_FRAMEWORK_SHORT_VERSION_STRING",&local_2f1);
    cmLGInfoProp(pcVar1,(cmTarget *)psVar6,&local_2f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    psVar6 = targetName_local;
    pcVar1 = local_258;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_318,"MACOSX_FRAMEWORK_BUNDLE_VERSION",&local_319);
    cmLGInfoProp(pcVar1,(cmTarget *)psVar6,&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)&local_319);
    pcVar1 = local_258;
    infile = (char *)std::__cxx11::string::c_str();
    pcVar3 = in;
    cmNewLineStyle::cmNewLineStyle(&local_320);
    cmMakefile::ConfigureFile(pcVar1,infile,pcVar3,false,false,false,&local_320);
    cmMakefile::PopScope(local_258);
    mf._4_4_ = 0;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    poVar5 = std::operator<<((ostream *)local_228,"Target ");
    psVar6 = cmTarget::GetName_abi_cxx11_((cmTarget *)targetName_local);
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    poVar5 = std::operator<<(poVar5," Info.plist template \"");
    poVar5 = std::operator<<(poVar5,local_88);
    std::operator<<(poVar5,"\" could not be found.");
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmSystemTools::Error(pcVar3,(char *)0x0,(char *)0x0,(char *)0x0);
    std::__cxx11::string::~string(local_248);
    mf._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  }
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

void cmLocalGenerator::GenerateFrameworkInfoPList(cmTarget* target,
                                                const std::string& targetName,
                                                const char* fname)
{
  // Find the Info.plist template.
  const char* in = target->GetProperty("MACOSX_FRAMEWORK_INFO_PLIST");
  std::string inFile = (in && *in)? in : "MacOSXFrameworkInfo.plist.in";
  if(!cmSystemTools::FileIsFullPath(inFile.c_str()))
    {
    std::string inMod = this->Makefile->GetModulesFile(inFile.c_str());
    if(!inMod.empty())
      {
      inFile = inMod;
      }
    }
  if(!cmSystemTools::FileExists(inFile.c_str(), true))
    {
    std::ostringstream e;
    e << "Target " << target->GetName() << " Info.plist template \""
      << inFile << "\" could not be found.";
    cmSystemTools::Error(e.str().c_str());
    return;
    }

  // Convert target properties to variables in an isolated makefile
  // scope to configure the file.  If properties are set they will
  // override user make variables.  If not the configuration will fall
  // back to the directory-level values set by the user.
  cmMakefile* mf = this->Makefile;
  mf->PushScope();
  mf->AddDefinition("MACOSX_FRAMEWORK_NAME", targetName.c_str());
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_ICON_FILE");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_IDENTIFIER");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_SHORT_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_FRAMEWORK_BUNDLE_VERSION");
  mf->ConfigureFile(inFile.c_str(), fname, false, false, false);
  mf->PopScope();
}